

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall
nonius::standard_reporter::print_outliers(standard_reporter *this,outlier_classification o)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ostream *poVar2;
  char *this_00;
  int iVar3;
  string local_50;
  
  pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                     (&(this->super_reporter).os);
  poVar2 = std::operator<<(pbVar1,"found ");
  iVar3 = o.high_mild + o.high_severe + o.low_mild + o.low_severe;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar3);
  poVar2 = std::operator<<(poVar2," outliers among ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,o.samples_seen);
  this_00 = " samples (";
  poVar2 = std::operator<<(poVar2," samples (");
  detail::percentage_abi_cxx11_(&local_50,(detail *)this_00,(double)iVar3 / (double)o.samples_seen);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  std::operator<<(poVar2,")\n");
  std::__cxx11::string::~string((string *)&local_50);
  if (this->verbose == true) {
    print_outlier_count(this,"low severe",o.low_severe,o.samples_seen);
    print_outlier_count(this,"low mild",o.low_mild,o.samples_seen);
    print_outlier_count(this,"high mild",o.high_mild,o.samples_seen);
    print_outlier_count(this,"high severe",o.high_severe,o.samples_seen);
  }
  return;
}

Assistant:

void print_outliers(outlier_classification o) {
            report_stream() << "found " << o.total() << " outliers among " << o.samples_seen << " samples (" << detail::percentage_ratio(o.total(), o.samples_seen) << ")\n";
            if(verbose) {
                print_outlier_count("low severe", o.low_severe, o.samples_seen);
                print_outlier_count("low mild", o.low_mild, o.samples_seen);
                print_outlier_count("high mild", o.high_mild, o.samples_seen);
                print_outlier_count("high severe", o.high_severe, o.samples_seen);
            }
        }